

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::MaybeWarnCMP0074(cmMakefile *this,string *pkg)

{
  pointer pcVar1;
  size_type sVar2;
  string *psVar3;
  ostream *poVar4;
  PolicyID id;
  bool bVar5;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  string varName;
  string env;
  ostringstream w;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  pcVar1 = (pkg->_M_dataplus)._M_p;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar1,pcVar1 + pkg->_M_string_length);
  std::__cxx11::string::append((char *)&local_1e8);
  psVar3 = (string *)GetDefinition(this,&local_1e8);
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  cmsys::SystemTools::GetEnv(&local_1e8,&local_1c8);
  sVar2 = local_1c8._M_string_length;
  if (psVar3 == (string *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = psVar3->_M_string_length != 0;
  }
  if (!(bool)(~bVar5 & local_1c8._M_string_length == 0)) {
    pVar6 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->WarnedCMP0074,&local_1e8);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_208,(cmPolicies *)0x4a,id);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"CMake variable ",0xf);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                            local_1e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," is set to:\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        if (psVar3 == (string *)0x0) {
          psVar3 = &cmValue::Empty_abi_cxx11_;
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      }
      if (sVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Environment variable ",0x15);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                            local_1e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," is set to:\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"For compatibility, CMake is ignoring the variable.",0x32);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_208,
                          &this->Backtrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefile::MaybeWarnCMP0074(std::string const& pkg)
{
  // Warn if a <pkg>_ROOT variable we may use is set.
  std::string const varName = pkg + "_ROOT";
  cmValue var = this->GetDefinition(varName);
  std::string env;
  cmSystemTools::GetEnv(varName, env);

  bool const haveVar = cmNonempty(var);
  bool const haveEnv = !env.empty();
  if ((haveVar || haveEnv) && this->WarnedCMP0074.insert(varName).second) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0074) << "\n";
    if (haveVar) {
      w << "CMake variable " << varName << " is set to:\n"
        << "  " << *var << "\n";
    }
    if (haveEnv) {
      w << "Environment variable " << varName << " is set to:\n"
        << "  " << env << "\n";
    }
    w << "For compatibility, CMake is ignoring the variable.";
    this->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }
}